

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O1

void __thiscall astar::AStar::MigratePoint(AStar *this,PointCost *pc,Point *start,Point *end)

{
  int iVar1;
  MoveType MVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  bool bVar6;
  int iVar7;
  __node_base_ptr p_Var8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  __node_base_ptr p_Var13;
  long lVar14;
  Point tmp;
  int cost;
  undefined1 local_89;
  Point local_88;
  int local_7c;
  vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>> *local_78;
  Point local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  Point *local_60;
  PointCost *local_58;
  priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
  local_50;
  
  if (0 < (int)this->moveType) {
    local_78 = (vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>> *)
               &this->openZone;
    lVar14 = 0;
    local_60 = end;
    local_58 = pc;
    do {
      local_70 = *(Point *)(MigratePoint::move + lVar14);
      local_88 = operator+(&pc->point,&local_70);
      uVar9 = local_88.x;
      iVar1 = (this->map).m;
      iVar10 = 0x7fffffff;
      if ((((int)uVar9 < iVar1) && (-1 < (int)(uVar9 | local_88.y))) && (local_88.y < (this->map).n)
         ) {
        iVar10 = *(int *)(*(long *)&(this->map).map.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(ulong)local_88 & 0xffffffff].
                                    super__Vector_base<int,_std::allocator<int>_> +
                         (ulong)(uint)local_88.y * 4);
      }
      if ((iVar10 != 1) && (iVar10 != 0x7fffffff)) {
        uVar9 = iVar1 * local_88.y + uVar9;
        uVar3 = (this->closeZone)._M_h._M_bucket_count;
        uVar12 = (ulong)uVar9 % uVar3;
        p_Var4 = (this->closeZone)._M_h._M_buckets[uVar12];
        p_Var8 = (__node_base_ptr)0x0;
        if ((p_Var4 != (__node_base_ptr)0x0) &&
           (p_Var8 = p_Var4, p_Var13 = p_Var4->_M_nxt, uVar9 != *(uint *)&p_Var4->_M_nxt[1]._M_nxt))
        {
          while (p_Var5 = p_Var13->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
            p_Var8 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar3 != uVar12) ||
               (p_Var8 = p_Var13, p_Var13 = p_Var5, uVar9 == *(uint *)&p_Var5[1]._M_nxt))
            goto LAB_00104135;
          }
          p_Var8 = (__node_base_ptr)0x0;
        }
LAB_00104135:
        if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0)) {
          std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>::vector
                    (&local_50.c,
                     (vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_> *)
                     local_78);
          bVar6 = InOpenZone(this,&local_50,&local_88);
          std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>::~vector
                    (&local_50.c);
          pc = local_58;
          if (!bVar6) {
            iVar10 = (local_58->point).x - local_88.x;
            iVar1 = -iVar10;
            if (0 < iVar10) {
              iVar1 = iVar10;
            }
            iVar11 = (local_58->point).y - local_88.y;
            iVar10 = -iVar11;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            MVar2 = this->moveType;
            if (MVar2 == D8) {
              iVar11 = iVar10;
              if (iVar10 < iVar1) {
                iVar11 = iVar1;
              }
            }
            else {
              iVar11 = 0;
              if (MVar2 == D4) {
                iVar11 = iVar10 + iVar1;
              }
            }
            iVar10 = local_88.x - local_60->x;
            iVar1 = -iVar10;
            if (0 < iVar10) {
              iVar1 = iVar10;
            }
            iVar7 = local_88.y - local_60->y;
            iVar10 = -iVar7;
            if (0 < iVar7) {
              iVar10 = iVar7;
            }
            if (MVar2 == D8) {
              local_7c = iVar10;
              if (iVar10 < iVar1) {
                local_7c = iVar1;
              }
            }
            else {
              local_7c = 0;
              if (MVar2 == D4) {
                local_7c = iVar10 + iVar1;
              }
            }
            local_7c = iVar11 + local_58->cost + local_7c;
            local_70.x = 0;
            local_70.y = 0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>,astar::AStar::PointCost_const&>
                      (&local_68,(PointCost **)&local_70,
                       (allocator<astar::AStar::PointCost> *)&local_89,local_58);
            std::vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>>::
            emplace_back<astar::Point&,int&,std::shared_ptr<astar::AStar::PointCost>>
                      (local_78,&local_88,&local_7c,(shared_ptr<astar::AStar::PointCost> *)&local_70
                      );
            std::
            push_heap<__gnu_cxx::__normal_iterator<astar::AStar::PointCost*,std::vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>>>,std::less<astar::AStar::PointCost>>
                      ((this->openZone).c.
                       super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->openZone).c.
                       super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
            }
          }
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (int)this->moveType);
  }
  return;
}

Assistant:

void MigratePoint(const PointCost& pc, const Point& start, const Point& end)
    {
        // up, down, left, right, diagonal up right, diagonal down right, diagonal down left, diagonal up left
        static int move[8][2] = {{0, -1}, {0, 1}, {-1, 0}, {1, 0}, {1, -1}, {1, 1}, {-1, 1}, {-1, -1}};
        for (int i = 0; i < moveType; i++) {
            auto tmp = pc.point + Point(move[i][0], move[i][1]);
            if (PointVaild(tmp)) {
                if (closeZone.find(tmp.x + tmp.y * map.Width()) != closeZone.end()) {
                    continue;
                }
                if (!InOpenZone(openZone, tmp)) {
                    int cost = pc.cost + MoveCast(pc.point, tmp) + MoveCast(tmp, end);
                    openZone.emplace(tmp, cost, std::make_shared<PointCost>(pc));
                }
            }
        }
    }